

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol.c
# Opt level: O2

int KINSol(void *kinmem,N_Vector u,int strategy_in,N_Vector u_scale,N_Vector f_scale)

{
  double *pdVar1;
  N_Vector p_Var2;
  code *pcVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  undefined8 uVar10;
  char *pcVar11;
  undefined4 in_register_00000014;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *module;
  char *extraout_RDX_01;
  char *module_00;
  char *module_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  char *extraout_RDX_05;
  char *module_02;
  char *module_03;
  char *extraout_RDX_06;
  char *extraout_RDX_07;
  char *extraout_RDX_08;
  char *extraout_RDX_09;
  char *extraout_RDX_10;
  char *module_04;
  char *module_05;
  char *extraout_RDX_11;
  char *extraout_RDX_12;
  char *extraout_RDX_13;
  char *extraout_RDX_14;
  char *extraout_RDX_15;
  char *extraout_RDX_16;
  char *extraout_RDX_17;
  char *module_06;
  char *extraout_RDX_18;
  char *extraout_RDX_19;
  char *extraout_RDX_20;
  char *extraout_RDX_21;
  char *extraout_RDX_22;
  char *extraout_RDX_23;
  char *extraout_RDX_24;
  char *module_07;
  char *extraout_RDX_25;
  char *extraout_RDX_26;
  char *extraout_RDX_27;
  char *module_08;
  char *module_09;
  char *extraout_RDX_28;
  char *extraout_RDX_29;
  char *extraout_RDX_30;
  char *extraout_RDX_31;
  char *extraout_RDX_32;
  char *extraout_RDX_33;
  char *extraout_RDX_34;
  char *module_10;
  char *extraout_RDX_35;
  char *extraout_RDX_36;
  char *module_11;
  char *extraout_RDX_37;
  char *extraout_RDX_38;
  char *extraout_RDX_39;
  char *extraout_RDX_40;
  char *module_12;
  char *module_13;
  char *extraout_RDX_41;
  char *extraout_RDX_42;
  ulong uVar12;
  KINMem pKVar13;
  char *pcVar14;
  long lVar15;
  uint uVar16;
  bool bVar17;
  double dVar18;
  sunrealtype sVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  double dVar28;
  double dVar29;
  undefined1 auVar30 [16];
  double local_100;
  double local_f8;
  double local_e8;
  double local_d8;
  double local_c0;
  undefined8 local_a8;
  double local_98;
  
  if (kinmem == (void *)0x0) {
    pcVar11 = "KINSol";
    pcVar14 = "kinsol_mem = NULL illegal.";
    uVar8 = 0xffffffff;
    kinmem = (KINMem)0x0;
    iVar7 = 0x1fb;
  }
  else if (*(int *)((long)kinmem + 0x2a8) == 0) {
    pcVar11 = "KINSol";
    pcVar14 = "Attempt to call before KINMalloc illegal.";
    uVar8 = 0xfffffffd;
    iVar7 = 0x204;
  }
  else {
    *(N_Vector *)((long)kinmem + 0x108) = u;
    *(N_Vector *)((long)kinmem + 0x128) = u_scale;
    *(N_Vector *)((long)kinmem + 0x130) = f_scale;
    *(int *)((long)kinmem + 0x30) = strategy_in;
    if (strategy_in == 3) {
      if (u == (N_Vector)0x0) {
        pcVar11 = "KINSol";
        pcVar14 = "uu = NULL illegal.";
        uVar8 = 0xfffffffe;
        iVar7 = 0x218;
      }
      else if (*(int *)((long)kinmem + 0x60) == 0) {
        pKVar13 = (KINMem)kinmem;
        KINPrintInfo((KINMem)kinmem,3,(char *)CONCAT44(in_register_00000014,strategy_in),
                     (char *)u_scale,"scsteptol = %12.3lg, fnormtol = %12.3lg",
                     *(undefined8 *)((long)kinmem + 0x28),*(undefined8 *)((long)kinmem + 0x20));
        *(undefined8 *)((long)kinmem + 0xe8) = 0;
        *(undefined8 *)((long)kinmem + 0xf0) = 0;
        *(undefined8 *)((long)kinmem + 0xd8) = 0;
        *(undefined8 *)((long)kinmem + 0xe0) = 0;
        *(undefined8 *)((long)kinmem + 0xf8) = 0;
        p_Var2 = *(N_Vector *)((long)kinmem + 0x148);
        *(undefined8 *)((long)kinmem + 0xd0) = 0;
        pdVar1 = (double *)((long)kinmem + 0x168);
        uVar12 = 0xfffffc19;
        pcVar11 = extraout_RDX_00;
        while ((int)uVar12 == -999) {
          *(long *)((long)kinmem + 0xd0) = *(long *)((long)kinmem + 0xd0) + 1;
          pKVar13 = *(KINMem *)((long)kinmem + 0x108);
          iVar7 = (**(code **)((long)kinmem + 0x10))
                            (pKVar13,*(undefined8 *)((long)kinmem + 0x118),
                             *(undefined8 *)((long)kinmem + 0x18));
          *(long *)((long)kinmem + 0xd8) = *(long *)((long)kinmem + 0xd8) + 1;
          if (iVar7 < 0) {
            KINPrintInfo(pKVar13,1,module,(char *)u_scale,"Return value: %d",0xfffffffffffffff3);
            goto LAB_0010a189;
          }
          if (*(long *)((long)kinmem + 0x1b8) == 0) {
LAB_00109e9a:
            pcVar3 = *(code **)((long)kinmem + 0x1d0);
            if (*(int *)((long)kinmem + 0x164) == 0) {
              if (pcVar3 != (code *)0x0) goto LAB_00109ebf;
              N_VScale(0x3ff0000000000000,*(undefined8 *)((long)kinmem + 0x118),
                       *(undefined8 *)((long)kinmem + 0x110));
              dVar18 = 1.0;
            }
            else {
              if (pcVar3 != (code *)0x0) {
LAB_00109ebf:
                u_scale = (N_Vector)0x0;
                iVar7 = (*pcVar3)(*(undefined8 *)((long)kinmem + 0xd0),
                                  *(undefined8 *)((long)kinmem + 0x108),
                                  *(undefined8 *)((long)kinmem + 0x118),0,0,
                                  *(undefined8 *)((long)kinmem + 0x18),pdVar1);
                if (iVar7 == 0) {
                  dVar18 = *pdVar1;
                  if ((0.0 < dVar18) && (dVar18 <= 1.0)) goto LAB_00109f10;
                  pcVar11 = "The damping parameter is outside of the range (0, 1].";
                  iVar7 = 0xb45;
                }
                else {
                  pcVar11 = "The damping function failed.";
                  iVar7 = 0xb3e;
                }
                pcVar14 = "KINFP";
                KINProcessError((KINMem)kinmem,-0x12,iVar7,"KINFP",
                                "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/kinsol/kinsol.c"
                                ,pcVar11);
                uVar8 = 0xffffffee;
                pcVar11 = extraout_RDX_04;
                pKVar13 = (KINMem)kinmem;
                goto LAB_0010a15d;
              }
              dVar18 = *pdVar1;
LAB_00109f10:
              N_VLinearSum(1.0 - dVar18,*(undefined8 *)((long)kinmem + 0x108),
                           *(undefined8 *)((long)kinmem + 0x118),
                           *(undefined8 *)((long)kinmem + 0x110));
              dVar18 = *(double *)((long)kinmem + 0x168);
            }
          }
          else {
            uVar12 = *(ulong *)((long)kinmem + 0x1c0);
            if (*(long *)((long)kinmem + 0xd0) <= (long)uVar12) goto LAB_00109e9a;
            if ((long)uVar12 < 1) {
              uVar12 = 0;
            }
            lVar15 = *(long *)((long)kinmem + 0xd0) + ~uVar12;
            u_scale = *(N_Vector *)((long)kinmem + 0x110);
            pKVar13 = (KINMem)kinmem;
            uVar8 = AndersonAcc((KINMem)kinmem,*(N_Vector *)((long)kinmem + 0x118),p_Var2,u_scale,
                                *(N_Vector *)((long)kinmem + 0x108),lVar15,
                                *(sunrealtype **)((long)kinmem + 0x1a8),
                                *(sunrealtype **)((long)kinmem + 0x1a0));
            if (uVar8 != 0) {
              uVar12 = (ulong)uVar8;
              pcVar11 = extraout_RDX_01;
              break;
            }
            dVar18 = 1.0;
            if ((lVar15 == 0) &&
               ((*(int *)((long)kinmem + 0x1f8) != 0 ||
                (dVar18 = 1.0, *(long *)((long)kinmem + 0x1d0) != 0)))) {
              dVar18 = *pdVar1;
            }
          }
          N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,*(undefined8 *)((long)kinmem + 0x110),
                       *(undefined8 *)((long)kinmem + 0x108),p_Var2);
          pKVar13 = (KINMem)kinmem;
          sVar19 = KINScFNorm((KINMem)kinmem,p_Var2,*(N_Vector *)((long)kinmem + 0x130));
          *(sunrealtype *)((long)kinmem + 0x260) = sVar19;
          KINPrintInfo(pKVar13,4,module_00,(char *)u_scale,"scaled f norm (for stopping) = %12.3lg")
          ;
          KINPrintInfo(pKVar13,2,module_01,(char *)u_scale,
                       "nni = %4ld, nfe = %6ld, fnorm = %26.16lg",
                       *(undefined8 *)((long)kinmem + 0x260),*(undefined8 *)((long)kinmem + 0xd0),
                       *(undefined8 *)((long)kinmem + 0xd8));
          uVar12 = 0xfffffffa;
          if (*(long *)((long)kinmem + 0xd0) < *(long *)((long)kinmem + 0x38)) {
            uVar12 = 0xfffffc19;
          }
          bVar17 = dVar18 * *(double *)((long)kinmem + 0x20) < *(double *)((long)kinmem + 0x260);
          u_scale = (N_Vector)CONCAT71((int7)((ulong)u_scale >> 8),bVar17);
          if (!bVar17) {
            uVar12 = 0;
          }
          if ((bVar17 && *(long *)((long)kinmem + 0xd0) < *(long *)((long)kinmem + 0x38)) ||
             (pcVar11 = extraout_RDX_02, *(int *)((long)kinmem + 0x160) != 0)) {
            pKVar13 = *(KINMem *)((long)kinmem + 0x110);
            N_VScale(0x3ff0000000000000,pKVar13,*(undefined8 *)((long)kinmem + 0x108));
            pcVar11 = extraout_RDX_03;
          }
        }
        iVar7 = (int)uVar12;
        KINPrintInfo(pKVar13,1,pcVar11,(char *)u_scale,"Return value: %d",uVar12);
        if (iVar7 == -6) {
          pcVar11 = "The maximum number of iterations was reached before convergence.";
          uVar8 = 0xfffffffa;
          iVar7 = 0x236;
          goto LAB_0010a1e8;
        }
        if (iVar7 != -0xd) {
          return iVar7;
        }
LAB_0010a189:
        pcVar11 = "KINSol";
        pcVar14 = "The system function failed in an unrecoverable manner.";
        uVar8 = 0xfffffff3;
        iVar7 = 0x232;
      }
      else {
        pcVar11 = "KINSol";
        pcVar14 = "Constraints not allowed with fixed point or Picard iterations";
        uVar8 = 0xfffffffe;
        iVar7 = 0x220;
      }
    }
    else if (u == (N_Vector)0x0) {
      pcVar11 = "KINSolInit";
      pcVar14 = "uu = NULL illegal.";
      uVar8 = 0xfffffffe;
      iVar7 = 0x584;
    }
    else if ((uint)strategy_in < 4) {
      if (u_scale == (N_Vector)0x0) {
        pcVar11 = "KINSolInit";
        pcVar14 = "uscale = NULL illegal.";
        uVar8 = 0xfffffffe;
        iVar7 = 0x597;
      }
      else {
        dVar18 = (double)N_VMin(u_scale);
        if (dVar18 <= 0.0) {
          pcVar11 = "KINSolInit";
          pcVar14 = "uscale has nonpositive elements.";
          uVar8 = 0xfffffffe;
          iVar7 = 0x59e;
        }
        else if (*(long *)((long)kinmem + 0x130) == 0) {
          pcVar11 = "KINSolInit";
          pcVar14 = "fscale = NULL illegal.";
          uVar8 = 0xfffffffe;
          iVar7 = 0x5a5;
        }
        else {
          dVar18 = (double)N_VMin();
          if (dVar18 <= 0.0) {
            pcVar11 = "KINSolInit";
            pcVar14 = "fscale has nonpositive elements.";
            uVar8 = 0xfffffffe;
            iVar7 = 0x5ac;
          }
          else {
            pKVar13 = *(KINMem *)((long)kinmem + 0x140);
            if (pKVar13 == (KINMem)0x0) {
              *(undefined4 *)((long)kinmem + 0x60) = 0;
              pcVar11 = extraout_RDX;
LAB_0010a1f7:
              KINPrintInfo(pKVar13,3,pcVar11,(char *)u_scale,
                           "scsteptol = %12.3lg, fnormtol = %12.3lg",
                           *(undefined8 *)((long)kinmem + 0x28));
              dVar18 = *(double *)((long)kinmem + 0x80);
              if ((dVar18 == 0.0) && (!NAN(dVar18))) {
                dVar18 = (double)N_VWL2Norm(*(undefined8 *)((long)kinmem + 0x108),
                                            *(undefined8 *)((long)kinmem + 0x128));
                dVar18 = dVar18 * 1000.0;
              }
              dVar24 = 1.0;
              if (1.0 <= dVar18) {
                dVar24 = dVar18;
              }
              *(double *)((long)kinmem + 0x78) = dVar24;
              if (*(int *)((long)kinmem + 0x250) == 0) {
                *(undefined4 *)((long)kinmem + 0x68) = 0;
              }
              else {
                bVar17 = *(int *)((long)kinmem + 0x58) != 3;
                u_scale = (N_Vector)(ulong)bVar17;
                *(uint *)((long)kinmem + 0x68) = (uint)bVar17;
                if (bVar17) {
                  if (*(int *)((long)kinmem + 0x58) == 1) {
                    *(undefined8 *)((long)kinmem + 0xb8) = 0x3ff9e3779b97f4a8;
                  }
                  *(undefined8 *)((long)kinmem + 0xa8) = 0x3fe0000000000000;
                }
                *(undefined4 *)((long)kinmem + 0x6c) = 1;
              }
              *(undefined8 *)((long)kinmem + 0xf0) = 0;
              *(undefined8 *)((long)kinmem + 0xf8) = 0;
              *(undefined8 *)((long)kinmem + 0xe0) = 0;
              *(undefined8 *)((long)kinmem + 0xe8) = 0;
              *(undefined8 *)((long)kinmem + 0xd0) = 0;
              *(undefined8 *)((long)kinmem + 0xd8) = 0;
              iVar7 = (**(code **)((long)kinmem + 0x10))
                                (*(undefined8 *)((long)kinmem + 0x108),
                                 *(undefined8 *)((long)kinmem + 0x118),
                                 *(undefined8 *)((long)kinmem + 0x18));
              *(long *)((long)kinmem + 0xd8) = *(long *)((long)kinmem + 0xd8) + 1;
              if (iVar7 < 0) {
                pcVar11 = "KINSolInit";
                pcVar14 = "The system function failed in an unrecoverable manner.";
                uVar8 = 0xfffffff3;
                iVar7 = 0x610;
              }
              else if (iVar7 == 0) {
                pKVar13 = (KINMem)kinmem;
                sVar19 = KINScFNorm((KINMem)kinmem,*(N_Vector *)((long)kinmem + 0x118),
                                    *(N_Vector *)((long)kinmem + 0x130));
                if (sVar19 <= *(double *)((long)kinmem + 0x20) * 0.01) {
                  uVar10 = N_VWL2Norm(*(undefined8 *)((long)kinmem + 0x118),
                                      *(undefined8 *)((long)kinmem + 0x130));
                  *(undefined8 *)((long)kinmem + 0x260) = uVar10;
                  return 1;
                }
                KINPrintInfo(pKVar13,4,module_02,(char *)u_scale,
                             "scaled f norm (for stopping) = %12.3lg");
                if ((*(code **)((long)kinmem + 0x230) == (code *)0x0) ||
                   (iVar7 = (**(code **)((long)kinmem + 0x230))(kinmem), iVar7 == 0)) {
                  pKVar13 = *(KINMem *)((long)kinmem + 0x118);
                  dVar18 = (double)N_VWL2Norm(pKVar13,*(undefined8 *)((long)kinmem + 0x130));
                  *(double *)((long)kinmem + 0x260) = dVar18;
                  *(double *)((long)kinmem + 0x268) = dVar18 * 0.5 * dVar18;
                  *(double *)((long)kinmem + 0x280) = dVar18;
                  uVar10 = *(undefined8 *)((long)kinmem + 0xd8);
                  KINPrintInfo(pKVar13,2,module_03,(char *)u_scale,
                               "nni = %4ld, nfe = %6ld, fnorm = %26.16lg",
                               *(undefined8 *)((long)kinmem + 0xd0),uVar10);
                  *(undefined8 *)((long)kinmem + 0x100) = 0;
                  *(undefined8 *)((long)kinmem + 200) =
                       *(undefined8 *)
                        (&DAT_00119050 + (ulong)(*(int *)((long)kinmem + 0xc0) == 0) * 8);
                  iVar7 = *(int *)((long)kinmem + 0x250);
                  dVar18 = 0.0;
                  if ((iVar7 != 0) && (*(int *)((long)kinmem + 0x5c) == 0)) {
                    dVar18 = *(double *)((long)kinmem + 0x20) * 0.01;
                  }
                  uVar8 = -(uint)(*(double *)((long)kinmem + 0x290) == 0.0) & 1;
                  pcVar11 = (char *)(ulong)uVar8;
                  *(uint *)((long)kinmem + 0x288) = uVar8;
                  if (*(int *)((long)kinmem + 0x30) != 2) {
                    bVar17 = false;
                    local_100 = -1.0;
                    dVar24 = -1.0;
                    uVar16 = 0;
LAB_0010a989:
                    *(undefined4 *)((long)kinmem + 0x70) = 0;
                    *(long *)((long)kinmem + 0xd0) = *(long *)((long)kinmem + 0xd0) + 1;
                    if (*(int *)((long)kinmem + 0x250) != 0) {
                      dVar20 = (*(double *)((long)kinmem + 0xa8) + *(double *)((long)kinmem + 8)) *
                               *(double *)((long)kinmem + 0x260);
                      *(double *)((long)kinmem + 0xa0) = dVar20;
                      if (*(int *)((long)kinmem + 0x5c) == 0) {
                        dVar22 = dVar18;
                        if (dVar18 <= dVar20) {
                          dVar22 = dVar20;
                        }
                        *(double *)((long)kinmem + 0xa0) = dVar22;
                      }
                    }
LAB_0010a9d5:
                    pKVar13 = (KINMem)kinmem;
                    if (*(int *)((long)kinmem + 0x30) == 1) {
                      uVar8 = KINLinSolDrv((KINMem)kinmem);
                      pcVar14 = extraout_RDX_21;
                      if (uVar8 == 0) {
                        pKVar13 = *(KINMem *)((long)kinmem + 0x138);
                        local_d8 = (double)N_VWL2Norm(pKVar13,*(undefined8 *)((long)kinmem + 0x128))
                        ;
                        dVar20 = *(double *)((long)kinmem + 0x78) / local_d8;
                        *(double *)((long)kinmem + 0x90) = local_d8;
                        if (local_d8 <= *(double *)((long)kinmem + 0x78)) {
                          local_f8 = 1.0;
                          pcVar14 = extraout_RDX_22;
                          local_c0 = dVar20;
                        }
                        else {
                          pKVar13 = *(KINMem *)((long)kinmem + 0x138);
                          N_VScale(dVar20,pKVar13,pKVar13);
                          local_d8 = *(double *)((long)kinmem + 0x78);
                          *(double *)((long)kinmem + 0x90) = local_d8;
                          local_c0 = 1.0;
                          pcVar14 = extraout_RDX_23;
                          local_f8 = dVar20;
                        }
                        *(undefined8 *)((long)kinmem + 0x98) = 0x3ff0000000000000;
                        if ((*(int *)((long)kinmem + 0x60) == 0) ||
                           (pKVar13 = (KINMem)kinmem, iVar7 = KINConstraint((KINMem)kinmem),
                           pcVar14 = extraout_RDX_24, iVar7 != -0x3e4)) {
LAB_0010acfb:
                          iVar7 = 5;
                          while( true ) {
                            bVar17 = iVar7 == 0;
                            iVar7 = iVar7 + -1;
                            if (bVar17) goto LAB_0010bad8;
                            N_VLinearSum(0x3ff0000000000000,0x3ff0000000000000,
                                         *(undefined8 *)((long)kinmem + 0x108),
                                         *(undefined8 *)((long)kinmem + 0x138),
                                         *(undefined8 *)((long)kinmem + 0x110));
                            pKVar13 = *(KINMem *)((long)kinmem + 0x110);
                            iVar9 = (**(code **)((long)kinmem + 0x10))
                                              (pKVar13,*(undefined8 *)((long)kinmem + 0x118),
                                               *(undefined8 *)((long)kinmem + 0x18));
                            *(long *)((long)kinmem + 0xd8) = *(long *)((long)kinmem + 0xd8) + 1;
                            if (iVar9 == 0) break;
                            pcVar14 = extraout_RDX_26;
                            if (iVar9 < 0) goto LAB_0010ba9c;
                            pKVar13 = *(KINMem *)((long)kinmem + 0x138);
                            N_VScale(0x3fe0000000000000,pKVar13,pKVar13);
                            local_f8 = local_f8 * 0.5;
                            local_d8 = local_d8 * 0.5;
                            *(double *)((long)kinmem + 0x90) = local_d8;
                            local_c0 = 1.0;
                            pcVar14 = extraout_RDX_27;
                          }
                          local_100 = (double)N_VWL2Norm(*(undefined8 *)((long)kinmem + 0x118),
                                                         *(undefined8 *)((long)kinmem + 0x130));
                          dVar21 = *(double *)((long)kinmem + 0x270) * local_f8;
                          pKVar13 = (KINMem)kinmem;
                          sVar19 = KINScSNorm((KINMem)kinmem,*(N_Vector *)((long)kinmem + 0x138),
                                              *(N_Vector *)((long)kinmem + 0x108));
                          dVar20 = *(double *)((long)kinmem + 0x28) / sVar19;
                          KINPrintInfo(pKVar13,8,module_09,pcVar11,
                                       "min_lam = %11.4le, f1norm = %11.4le, pnorm = %11.4le",dVar20
                                       ,*(undefined8 *)((long)kinmem + 0x268),SUB84(local_d8,0));
                          dVar23 = dVar21 * 0.0001;
                          iVar7 = 0;
                          local_98 = 0.0;
                          local_a8 = 0.0;
                          bVar17 = false;
                          pcVar14 = extraout_RDX_28;
                          dVar22 = 1.0;
                          dVar24 = local_100 * 0.5 * local_100;
                          do {
                            dVar25 = dVar24;
                            local_e8 = dVar22;
                            dVar28 = dVar23 * local_e8 + *(double *)((long)kinmem + 0x268);
                            KINPrintInfo(pKVar13,9,pcVar14,pcVar11,
                                         "fnorm = %15.8le, f1norm = %15.8le, alpha_cond = %15.8le,lam = %15.8le"
                                        );
                            dVar22 = *(double *)((long)kinmem + 0x268);
                            if (dVar25 <= dVar28) {
                              dVar21 = dVar21 * 0.9;
                              pcVar14 = extraout_RDX_29;
                              dVar24 = dVar25;
                              if (dVar21 * local_e8 + dVar22 <= dVar25) goto LAB_0010b730;
                              if ((local_e8 != 1.0) || (NAN(local_e8))) goto LAB_0010b48c;
                              if (local_d8 < *(double *)((long)kinmem + 0x78)) {
                                local_a8 = 1.0;
                                goto LAB_0010b341;
                              }
                              local_e8 = 1.0;
                              goto LAB_0010b730;
                            }
                            if (bVar17) {
                              dVar24 = (dVar25 - dVar22) - local_e8 * dVar21;
                              dVar29 = (local_a8 - dVar22) - local_98 * dVar21;
                              dVar28 = 1.0 / (local_e8 - local_98);
                              dVar22 = ((1.0 / (local_e8 * local_e8)) * dVar24 +
                                       (-1.0 / (local_98 * local_98)) * dVar29) * dVar28;
                              dVar28 = dVar28 * ((local_e8 / (local_98 * local_98)) * dVar29 -
                                                (local_98 / (local_e8 * local_e8)) * dVar24);
                              dVar24 = dVar22 * 3.0;
                              if (*(double *)((long)kinmem + 8) <= ABS(dVar22)) {
                                dVar29 = dVar28 * dVar28 - dVar21 * dVar24;
                                dVar22 = 0.0;
                                if (0.0 < dVar29) {
                                  if (dVar29 < 0.0) {
                                    dVar22 = sqrt(dVar29);
                                  }
                                  else {
                                    dVar22 = SQRT(dVar29);
                                  }
                                }
                                dVar24 = (dVar22 - dVar28) / dVar24;
                              }
                              else {
                                dVar24 = -dVar21 / (dVar28 + dVar28);
                              }
                            }
                            else {
                              dVar24 = (dVar25 - dVar22) - dVar21;
                              dVar24 = -dVar21 / (dVar24 + dVar24);
                            }
                            dVar28 = local_e8 * 0.5;
                            if (dVar24 <= local_e8 * 0.5) {
                              dVar28 = dVar24;
                            }
                            dVar22 = local_e8 * 0.1;
                            if (local_e8 * 0.1 <= dVar28) {
                              dVar22 = dVar28;
                            }
                            N_VLinearSum(0x3ff0000000000000,*(undefined8 *)((long)kinmem + 0x108),
                                         *(undefined8 *)((long)kinmem + 0x138),
                                         *(undefined8 *)((long)kinmem + 0x110));
                            pKVar13 = *(KINMem *)((long)kinmem + 0x110);
                            iVar9 = (**(code **)((long)kinmem + 0x10))
                                              (pKVar13,*(undefined8 *)((long)kinmem + 0x118),
                                               *(undefined8 *)((long)kinmem + 0x18));
                            *(long *)((long)kinmem + 0xd8) = *(long *)((long)kinmem + 0xd8) + 1;
                            pcVar14 = extraout_RDX_30;
                            if (iVar9 != 0) goto LAB_0010ba9c;
                            iVar7 = iVar7 + 1;
                            pKVar13 = *(KINMem *)((long)kinmem + 0x118);
                            local_100 = (double)N_VWL2Norm(pKVar13,*(undefined8 *)
                                                                    ((long)kinmem + 0x130));
                            dVar24 = local_100 * 0.5 * local_100;
                            bVar17 = true;
                            pcVar14 = extraout_RDX_31;
                            local_a8 = dVar25;
                            local_98 = local_e8;
                          } while (dVar20 <= dVar22);
                          pKVar13 = *(KINMem *)((long)kinmem + 0x108);
                          N_VScale(0x3ff0000000000000,pKVar13,*(undefined8 *)((long)kinmem + 0x110))
                          ;
                          pcVar14 = extraout_RDX_32;
                        }
                        else {
                          pKVar13 = *(KINMem *)((long)kinmem + 0x138);
                          N_VScale(*(undefined8 *)((long)kinmem + 0x98),pKVar13,pKVar13);
                          dVar20 = *(double *)((long)kinmem + 0x98);
                          local_d8 = local_d8 * dVar20;
                          *(double *)((long)kinmem + 0x90) = local_d8;
                          KINPrintInfo(pKVar13,6,module_07,pcVar11,"(ivio=1) pnorm = %12.4le");
                          if (*(double *)((long)kinmem + 0x28) < local_d8) {
                            local_f8 = local_f8 * dVar20;
                            local_c0 = 1.0;
                            pcVar14 = extraout_RDX_25;
                            goto LAB_0010acfb;
                          }
                          pKVar13 = *(KINMem *)((long)kinmem + 0x108);
                          N_VLinearSum(0x3ff0000000000000,0x3ff0000000000000,pKVar13,
                                       *(undefined8 *)((long)kinmem + 0x138),
                                       *(undefined8 *)((long)kinmem + 0x110));
                          pcVar14 = extraout_RDX_33;
                        }
                        iVar7 = -0x3e5;
                        goto LAB_0010b236;
                      }
                    }
                    else {
                      if (*(int *)((long)kinmem + 0x30) != 0) {
LAB_0010b252:
                        iVar7 = 0;
                        goto LAB_0010b254;
                      }
                      uVar8 = KINLinSolDrv((KINMem)kinmem);
                      pcVar14 = extraout_RDX_13;
                      if (uVar8 == 0) {
                        pKVar13 = *(KINMem *)((long)kinmem + 0x138);
                        local_f8 = (double)N_VWL2Norm(pKVar13,*(undefined8 *)((long)kinmem + 0x128))
                        ;
                        local_d8 = 1.0;
                        pcVar14 = extraout_RDX_14;
                        if (*(double *)((long)kinmem + 0x78) < local_f8) {
                          local_d8 = *(double *)((long)kinmem + 0x78) / local_f8;
                          pKVar13 = *(KINMem *)((long)kinmem + 0x138);
                          N_VScale(pKVar13,pKVar13);
                          local_f8 = *(double *)((long)kinmem + 0x78);
                          pcVar14 = extraout_RDX_15;
                        }
                        KINPrintInfo(pKVar13,5,pcVar14,pcVar11,"pnorm = %12.4le",local_f8);
                        *(double *)((long)kinmem + 0x90) = local_f8;
                        *(undefined8 *)((long)kinmem + 0x98) = 0x3ff0000000000000;
                        pcVar14 = extraout_RDX_16;
                        if ((*(int *)((long)kinmem + 0x60) == 0) ||
                           (pKVar13 = (KINMem)kinmem, iVar7 = KINConstraint((KINMem)kinmem),
                           pcVar14 = extraout_RDX_17, iVar7 != -0x3e4)) {
LAB_0010ab15:
                          iVar7 = 5;
                          while( true ) {
                            bVar17 = iVar7 == 0;
                            iVar7 = iVar7 + -1;
                            if (bVar17) goto LAB_0010bad8;
                            N_VLinearSum(0x3ff0000000000000,0x3ff0000000000000,
                                         *(undefined8 *)((long)kinmem + 0x108),
                                         *(undefined8 *)((long)kinmem + 0x138),
                                         *(undefined8 *)((long)kinmem + 0x110));
                            pKVar13 = *(KINMem *)((long)kinmem + 0x110);
                            iVar9 = (**(code **)((long)kinmem + 0x10))
                                              (pKVar13,*(undefined8 *)((long)kinmem + 0x118),
                                               *(undefined8 *)((long)kinmem + 0x18));
                            *(long *)((long)kinmem + 0xd8) = *(long *)((long)kinmem + 0xd8) + 1;
                            if (iVar9 == 0) break;
                            pcVar14 = extraout_RDX_19;
                            if (iVar9 < 0) goto LAB_0010ba9c;
                            local_d8 = local_d8 * 0.5;
                            pKVar13 = *(KINMem *)((long)kinmem + 0x138);
                            N_VScale(0x3fe0000000000000,pKVar13,pKVar13);
                            local_f8 = local_f8 * 0.5;
                            *(double *)((long)kinmem + 0x90) = local_f8;
                            pcVar14 = extraout_RDX_20;
                          }
                          pKVar13 = *(KINMem *)((long)kinmem + 0x118);
                          local_100 = (double)N_VWL2Norm(pKVar13,*(undefined8 *)
                                                                  ((long)kinmem + 0x130));
                          dVar24 = local_100 * 0.5 * local_100;
                          dVar20 = local_d8 * *(double *)((long)kinmem + 0x278);
                          auVar30._8_4_ = SUB84(dVar20,0);
                          auVar30._0_8_ = local_d8 * *(double *)((long)kinmem + 0x270);
                          auVar30._12_4_ = (int)((ulong)dVar20 >> 0x20);
                          *(undefined1 (*) [16])((long)kinmem + 0x270) = auVar30;
                          KINPrintInfo(pKVar13,7,module_08,pcVar11,"fnorm(L2) = %20.8le");
                          uVar16 = 0;
                          if (local_f8 <= *(double *)((long)kinmem + 0x78) * 0.99) {
                            bVar17 = false;
                          }
                          else {
                            bVar17 = true;
                          }
                          goto LAB_0010b252;
                        }
                        dVar20 = *(double *)((long)kinmem + 0x98);
                        pKVar13 = *(KINMem *)((long)kinmem + 0x138);
                        N_VScale(pKVar13,pKVar13);
                        local_f8 = local_f8 * *(double *)((long)kinmem + 0x98);
                        *(double *)((long)kinmem + 0x90) = local_f8;
                        KINPrintInfo(pKVar13,5,module_06,pcVar11,"pnorm = %12.4le");
                        if (*(double *)((long)kinmem + 0x28) < local_f8) {
                          local_d8 = local_d8 * dVar20;
                          pcVar14 = extraout_RDX_18;
                          goto LAB_0010ab15;
                        }
                        N_VLinearSum(0x3ff0000000000000,0x3ff0000000000000,
                                     *(undefined8 *)((long)kinmem + 0x108),
                                     *(undefined8 *)((long)kinmem + 0x138),
                                     *(undefined8 *)((long)kinmem + 0x110));
                        iVar7 = -0x3e5;
                        bVar17 = false;
                        goto LAB_0010b24a;
                      }
                    }
                    goto LAB_0010bb3d;
                  }
                  pcVar11 = extraout_RDX_06;
                  if (*(long *)((long)kinmem + 0x120) != 0) {
LAB_0010a56b:
                    p_Var2 = *(N_Vector *)((long)kinmem + 0x148);
                    *(undefined8 *)((long)kinmem + 0xd0) = 0;
                    local_d8 = 0.0;
                    if ((iVar7 != 0) && (local_d8 = 0.0, *(int *)((long)kinmem + 0x5c) == 0)) {
                      local_d8 = *(double *)((long)kinmem + 0x20) * 0.01;
                    }
                    pdVar1 = (double *)((long)kinmem + 0x168);
                    uVar8 = 0xfffffc19;
                    pcVar14 = (char *)p_Var2;
                    while (uVar8 == 0xfffffc19) {
                      lVar15 = *(long *)((long)kinmem + 0xd0) + 1;
                      *(long *)((long)kinmem + 0xd0) = lVar15;
                      if (*(int *)((long)kinmem + 0x250) != 0) {
                        dVar18 = (*(double *)((long)kinmem + 0xa8) + *(double *)((long)kinmem + 8))
                                 * *(double *)((long)kinmem + 0x260);
                        *(double *)((long)kinmem + 0xa0) = dVar18;
                        if (*(int *)((long)kinmem + 0x5c) == 0) {
                          dVar24 = local_d8;
                          if (local_d8 <= dVar18) {
                            dVar24 = dVar18;
                          }
                          *(double *)((long)kinmem + 0xa0) = dVar24;
                        }
                      }
                      uVar10 = *(undefined8 *)((long)kinmem + 0x120);
                      uVar4 = *(undefined8 *)((long)kinmem + 0x108);
                      uVar5 = *(undefined8 *)((long)kinmem + 0x118);
                      if (*(long *)((long)kinmem + 0x40) <= lVar15 - *(long *)((long)kinmem + 0xe0))
                      {
                        *(undefined8 *)((long)kinmem + 200) = 0x4000000000000000;
                        *(undefined4 *)((long)kinmem + 0x74) = 1;
                        *(undefined4 *)((long)kinmem + 100) = 0;
                        goto LAB_0010a67c;
                      }
                      *(undefined4 *)((long)kinmem + 100) = 0;
                      if (1.5 < *(double *)((long)kinmem + 200)) goto LAB_0010a67c;
                      while( true ) {
                        N_VScale(0xbff0000000000000,uVar5,uVar5);
                        pcVar14 = (char *)((long)kinmem + 0x278);
                        pKVar13 = (KINMem)kinmem;
                        iVar7 = (**(code **)((long)kinmem + 0x240))
                                          (kinmem,uVar10,uVar5,(N_Vector)((long)kinmem + 0x278),
                                           (long)kinmem + 0x270);
                        if (iVar7 == 0) break;
                        pcVar11 = extraout_RDX_08;
                        if (((iVar7 < 0) || (*(long *)((long)kinmem + 0x238) == 0)) ||
                           (*(int *)((long)kinmem + 100) != 0)) goto LAB_0010ba88;
                        *(undefined8 *)((long)kinmem + 200) = 0x4000000000000000;
LAB_0010a67c:
                        if (*(code **)((long)kinmem + 0x238) != (code *)0x0) {
                          pKVar13 = (KINMem)kinmem;
                          iVar7 = (**(code **)((long)kinmem + 0x238))();
                          *(undefined4 *)((long)kinmem + 100) = 1;
                          pcVar14 = *(char **)((long)kinmem + 0xd0);
                          *(char **)((long)kinmem + 0xe0) = pcVar14;
                          *(char **)((long)kinmem + 0xe8) = pcVar14;
                          pcVar11 = extraout_RDX_07;
                          if (iVar7 != 0) goto LAB_0010ba88;
                        }
                      }
                      N_VLinearSum(0x3ff0000000000000,0x3ff0000000000000,uVar4,uVar10,uVar10);
                      if (*(long *)((long)kinmem + 0x1b8) == 0) {
LAB_0010a7a0:
                        pcVar3 = *(code **)((long)kinmem + 0x1d0);
                        if (*(int *)((long)kinmem + 0x164) == 0) {
                          if (pcVar3 != (code *)0x0) goto LAB_0010a7ca;
                          N_VScale(0x3ff0000000000000,*(undefined8 *)((long)kinmem + 0x120),
                                   *(undefined8 *)((long)kinmem + 0x110));
                        }
                        else {
                          if (pcVar3 != (code *)0x0) {
LAB_0010a7ca:
                            pcVar14 = (char *)0x0;
                            iVar7 = (*pcVar3)(*(undefined8 *)((long)kinmem + 0xd0),
                                              *(undefined8 *)((long)kinmem + 0x108),
                                              *(undefined8 *)((long)kinmem + 0x118),0,0,
                                              *(undefined8 *)((long)kinmem + 0x18),pdVar1);
                            if (iVar7 == 0) {
                              dVar18 = *pdVar1;
                              if ((0.0 < dVar18) && (dVar18 <= 1.0)) goto LAB_0010a817;
                              pcVar11 = "The damping parameter is outside of the range (0, 1].";
                              iVar7 = 0xa6d;
                            }
                            else {
                              pcVar11 = "The damping function failed.";
                              iVar7 = 0xa66;
                            }
                            uVar8 = 0xffffffee;
                            pcVar14 = "KINPicardAA";
                            KINProcessError((KINMem)kinmem,-0x12,iVar7,"KINPicardAA",
                                            "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/kinsol/kinsol.c"
                                            ,pcVar11);
                            pcVar11 = extraout_RDX_42;
                            pKVar13 = (KINMem)kinmem;
                            break;
                          }
                          dVar18 = *pdVar1;
LAB_0010a817:
                          N_VLinearSum(1.0 - dVar18,*(undefined8 *)((long)kinmem + 0x108),
                                       *(undefined8 *)((long)kinmem + 0x120),
                                       *(undefined8 *)((long)kinmem + 0x110));
                        }
                      }
                      else {
                        uVar12 = *(ulong *)((long)kinmem + 0x1c0);
                        if (*(long *)((long)kinmem + 0xd0) <= (long)uVar12) goto LAB_0010a7a0;
                        if ((long)uVar12 < 1) {
                          uVar12 = 0;
                        }
                        pcVar14 = *(char **)((long)kinmem + 0x110);
                        pKVar13 = (KINMem)kinmem;
                        uVar8 = AndersonAcc((KINMem)kinmem,*(N_Vector *)((long)kinmem + 0x120),
                                            p_Var2,(N_Vector)pcVar14,
                                            *(N_Vector *)((long)kinmem + 0x108),
                                            *(long *)((long)kinmem + 0xd0) + ~uVar12,
                                            *(sunrealtype **)((long)kinmem + 0x1a8),
                                            *(sunrealtype **)((long)kinmem + 0x1a0));
                        pcVar11 = extraout_RDX_09;
                        if (uVar8 != 0) break;
                      }
                      pKVar13 = *(KINMem *)((long)kinmem + 0x110);
                      iVar7 = (**(code **)((long)kinmem + 0x10))
                                        (pKVar13,*(undefined8 *)((long)kinmem + 0x118),
                                         *(undefined8 *)((long)kinmem + 0x18));
                      *(long *)((long)kinmem + 0xd8) = *(long *)((long)kinmem + 0xd8) + 1;
                      pcVar11 = extraout_RDX_10;
                      if (iVar7 < 0) {
LAB_0010ba88:
                        uVar8 = 0xfffffff3;
                        break;
                      }
                      pKVar13 = (KINMem)kinmem;
                      sVar19 = KINScFNorm((KINMem)kinmem,*(N_Vector *)((long)kinmem + 0x118),
                                          *(N_Vector *)((long)kinmem + 0x130));
                      *(sunrealtype *)((long)kinmem + 0x260) = sVar19;
                      KINPrintInfo(pKVar13,4,module_04,pcVar14,
                                   "scaled f norm (for stopping) = %12.3lg");
                      KINPrintInfo(pKVar13,2,module_05,pcVar14,
                                   "nni = %4ld, nfe = %6ld, fnorm = %26.16lg",
                                   *(undefined8 *)((long)kinmem + 0x260),
                                   *(undefined8 *)((long)kinmem + 0xd0),
                                   *(undefined8 *)((long)kinmem + 0xd8));
                      lVar15 = *(long *)((long)kinmem + 0xd0);
                      lVar6 = *(long *)((long)kinmem + 0x38);
                      uVar8 = 0xfffffffa;
                      if (lVar15 < lVar6) {
                        uVar8 = 0xfffffc19;
                      }
                      bVar17 = *(double *)((long)kinmem + 0x260) <= *(double *)((long)kinmem + 0x20)
                      ;
                      if (bVar17) {
                        uVar8 = 0;
                      }
                      pKVar13 = *(KINMem *)((long)kinmem + 0x110);
                      N_VScale(0x3ff0000000000000,pKVar13,*(undefined8 *)((long)kinmem + 0x108));
                      pcVar11 = extraout_RDX_11;
                      if ((!bVar17 && lVar15 < lVar6) && (*(int *)((long)kinmem + 0x68) != 0)) {
                        sVar19 = (sunrealtype)
                                 N_VWL2Norm(*(undefined8 *)((long)kinmem + 0x118),
                                            *(undefined8 *)((long)kinmem + 0x130));
                        pKVar13 = (KINMem)kinmem;
                        KINForcingTerm((KINMem)kinmem,sVar19);
                        pcVar11 = extraout_RDX_12;
                      }
                    }
LAB_0010a15d:
                    KINPrintInfo(pKVar13,1,pcVar11,pcVar14,"Return value: %d",(ulong)uVar8);
                    return uVar8;
                  }
                  pKVar13 = *(KINMem *)((long)kinmem + 0x110);
                  auVar30 = N_VClone();
                  pcVar11 = auVar30._8_8_;
                  *(long *)((long)kinmem + 0x120) = auVar30._0_8_;
                  if (auVar30._0_8_ != 0) {
                    *(long *)((long)kinmem + 0x220) =
                         *(long *)((long)kinmem + 0x220) + *(long *)((long)kinmem + 0x210);
                    *(long *)((long)kinmem + 0x228) =
                         *(long *)((long)kinmem + 0x228) + *(long *)((long)kinmem + 0x218);
                    iVar7 = *(int *)((long)kinmem + 0x250);
                    goto LAB_0010a56b;
                  }
                  pcVar11 = "KINSol";
                  pcVar14 = "A memory request failed.";
                  uVar8 = 0xfffffffc;
                  iVar7 = 0x268;
                }
                else {
                  pcVar11 = "KINSolInit";
                  pcVar14 = "The linear solver\'s init routine failed.";
                  uVar8 = 0xfffffff6;
                  iVar7 = 0x62d;
                }
              }
              else {
                pcVar11 = "KINSolInit";
                pcVar14 = "The system function failed at the first call.";
                uVar8 = 0xfffffff2;
                iVar7 = 0x616;
              }
            }
            else if ((*(uint *)((long)kinmem + 0x30) & 0xfffffffe) == 2) {
              pcVar11 = "KINSolInit";
              pcVar14 = "Constraints not allowed with fixed point or Picard iterations";
              uVar8 = 0xfffffffe;
              iVar7 = 0x5b5;
            }
            else {
              *(undefined4 *)((long)kinmem + 0x60) = 1;
              if ((*(long *)((long)pKVar13->kin_uround + 0xe0) == 0) ||
                 (*(long *)((long)pKVar13->kin_uround + 0xe8) == 0)) {
                pcVar11 = "KINSolInit";
                pcVar14 = "A required vector operation is not implemented.";
                uVar8 = 0xfffffffe;
                iVar7 = 0x5c6;
              }
              else {
                iVar7 = N_VConstrMask(pKVar13,*(undefined8 *)((long)kinmem + 0x108),
                                      *(undefined8 *)((long)kinmem + 0x148));
                pcVar11 = extraout_RDX_05;
                if (iVar7 != 0) goto LAB_0010a1f7;
                pcVar11 = "KINSolInit";
                pcVar14 = "Initial guess does NOT meet constraints.";
                uVar8 = 0xfffffffe;
                iVar7 = 0x5d3;
              }
            }
          }
        }
      }
    }
    else {
      pcVar11 = "KINSolInit";
      pcVar14 = "Illegal value for global strategy.";
      uVar8 = 0xfffffffe;
      iVar7 = 0x590;
    }
  }
  goto LAB_0010a1ab;
LAB_0010bad8:
  KINPrintInfo(pKVar13,1,pcVar14,pcVar11,"Return value: %d",0xfffffffffffffff1);
  goto switchD_0010bb6b_caseD_fffffff1;
  while( true ) {
    iVar7 = iVar7 + 1;
    pKVar13 = *(KINMem *)((long)kinmem + 0x118);
    local_100 = (double)N_VWL2Norm(pKVar13,*(undefined8 *)((long)kinmem + 0x130));
    dVar24 = local_100 * 0.5 * local_100;
    dVar22 = *(double *)((long)kinmem + 0x268);
    dVar28 = dVar23 * local_e8 + dVar22;
    KINPrintInfo(pKVar13,10,module_10,pcVar11,"f1norm = %15.8le, beta_cond = %15.8le, lam = %15.8le"
                 ,dVar24);
    bVar17 = dVar21 * local_e8 + dVar22 <= dVar24;
    if ((dVar28 < dVar24 || bVar17) || (local_c0 <= local_a8)) break;
LAB_0010b341:
    local_98 = local_a8;
    local_a8 = local_a8 + local_a8;
    local_e8 = local_a8;
    if (local_c0 <= local_a8) {
      local_e8 = local_c0;
    }
    N_VLinearSum(0x3ff0000000000000,*(undefined8 *)((long)kinmem + 0x108),
                 *(undefined8 *)((long)kinmem + 0x138),*(undefined8 *)((long)kinmem + 0x110));
    pKVar13 = *(KINMem *)((long)kinmem + 0x110);
    iVar9 = (**(code **)((long)kinmem + 0x10))
                      (pKVar13,*(undefined8 *)((long)kinmem + 0x118),
                       *(undefined8 *)((long)kinmem + 0x18));
    *(long *)((long)kinmem + 0xd8) = *(long *)((long)kinmem + 0xd8) + 1;
    pcVar14 = extraout_RDX_34;
    if (iVar9 != 0) goto LAB_0010ba9c;
  }
  pcVar14 = extraout_RDX_35;
  if (dVar28 >= dVar24 && !bVar17) {
    local_e8 = local_c0;
  }
LAB_0010b48c:
  if ((local_e8 < 1.0) || ((1.0 < local_e8 && (dVar28 < dVar24)))) {
    uVar26 = SUB84(local_e8,0);
    uVar27 = (undefined4)((ulong)local_e8 >> 0x20);
    if (local_98 <= local_e8) {
      uVar26 = SUB84(local_98,0);
      uVar27 = (undefined4)((ulong)local_98 >> 0x20);
    }
    local_a8 = (double)CONCAT44(uVar27,uVar26);
    local_98 = ABS(local_98 - local_e8);
    do {
      local_c0 = local_98;
      local_98 = local_c0;
      do {
        local_c0 = local_98;
        local_98 = local_c0 * 0.5;
        local_e8 = local_a8 + local_98;
        N_VLinearSum(0x3ff0000000000000,*(undefined8 *)((long)kinmem + 0x108),
                     *(undefined8 *)((long)kinmem + 0x138),*(undefined8 *)((long)kinmem + 0x110));
        pKVar13 = *(KINMem *)((long)kinmem + 0x110);
        iVar9 = (**(code **)((long)kinmem + 0x10))
                          (pKVar13,*(undefined8 *)((long)kinmem + 0x118),
                           *(undefined8 *)((long)kinmem + 0x18));
        *(long *)((long)kinmem + 0xd8) = *(long *)((long)kinmem + 0xd8) + 1;
        pcVar14 = extraout_RDX_36;
        if (iVar9 != 0) goto LAB_0010ba9c;
        iVar7 = iVar7 + 1;
        pKVar13 = *(KINMem *)((long)kinmem + 0x118);
        local_100 = (double)N_VWL2Norm(pKVar13,*(undefined8 *)((long)kinmem + 0x130));
        dVar24 = local_100 * 0.5 * local_100;
        dVar22 = dVar23 * local_e8 + *(double *)((long)kinmem + 0x268);
        dVar28 = dVar21 * local_e8 + *(double *)((long)kinmem + 0x268);
        KINPrintInfo(pKVar13,0xb,module_11,pcVar11,
                     "f1norm = %15.8le, alpha_cond = %15.8le, beta_cond = %15.8le, lam = %15.8le",
                     dVar24,dVar22);
      } while (dVar22 < dVar24);
      if (dVar28 <= dVar24) break;
      local_98 = local_c0 - local_98;
      local_a8 = (double)(~-(ulong)(dVar24 < dVar28) & (ulong)local_a8 |
                         -(ulong)(dVar24 < dVar28) & (ulong)local_e8);
    } while (dVar20 <= local_98);
    pcVar14 = extraout_RDX_37;
    if (dVar24 < dVar28) {
      N_VLinearSum(0x3ff0000000000000,local_e8,*(undefined8 *)((long)kinmem + 0x108),
                   *(undefined8 *)((long)kinmem + 0x138),*(undefined8 *)((long)kinmem + 0x110));
      pKVar13 = *(KINMem *)((long)kinmem + 0x110);
      iVar9 = (**(code **)((long)kinmem + 0x10))
                        (pKVar13,*(undefined8 *)((long)kinmem + 0x118),
                         *(undefined8 *)((long)kinmem + 0x18));
      *(long *)((long)kinmem + 0xd8) = *(long *)((long)kinmem + 0xd8) + 1;
      pcVar14 = extraout_RDX_38;
      if (iVar9 != 0) {
LAB_0010ba9c:
        KINPrintInfo(pKVar13,1,pcVar14,pcVar11,"Return value: %d",0xfffffffffffffff3);
        goto switchD_0010bb6b_caseD_fffffff3;
      }
      pKVar13 = *(KINMem *)((long)kinmem + 0x118);
      local_100 = (double)N_VWL2Norm(pKVar13,*(undefined8 *)((long)kinmem + 0x130));
      *(long *)((long)kinmem + 0xf0) = *(long *)((long)kinmem + 0xf0) + 1;
      pcVar14 = extraout_RDX_39;
      dVar24 = local_100 * 0.5 * local_100;
    }
  }
LAB_0010b730:
  *(long *)((long)kinmem + 0xf8) = *(long *)((long)kinmem + 0xf8) + (long)iVar7;
  iVar7 = 0;
  KINPrintInfo(pKVar13,0xc,pcVar14,pcVar11,"no. of lambda adjustments = %ld");
  *(double *)((long)kinmem + 0x270) = local_f8 * local_e8 * *(double *)((long)kinmem + 0x270);
  *(double *)((long)kinmem + 0x278) = local_f8 * local_e8 * *(double *)((long)kinmem + 0x278);
  pcVar14 = extraout_RDX_40;
  if (local_d8 * local_e8 <= *(double *)((long)kinmem + 0x78) * 0.99) {
LAB_0010b236:
    bVar17 = false;
  }
  else {
    bVar17 = true;
  }
  if (*(long *)((long)kinmem + 0x50) < *(long *)((long)kinmem + 0xf0)) {
    KINPrintInfo(pKVar13,1,pcVar14,pcVar11,"Return value: %d",0xfffffffffffffff8);
    goto switchD_0010bb6b_caseD_fffffff8;
  }
LAB_0010b24a:
  uVar16 = 0;
LAB_0010b254:
  uVar8 = uVar16;
  if ((*(uint *)((long)kinmem + 0x30) & 0xfffffffe) == 2) goto LAB_0010b8ba;
  if (*(int *)((long)kinmem + 0x68) != 0) {
    KINForcingTerm((KINMem)kinmem,local_100);
  }
  *(double *)((long)kinmem + 0x260) = local_100;
  if (iVar7 == -0x3e5) {
    if ((*(long *)((long)kinmem + 0x238) == 0) || (*(int *)((long)kinmem + 100) != 0))
    goto LAB_0010b7a3;
    *(undefined8 *)((long)kinmem + 200) = 0x4000000000000000;
    *(undefined4 *)((long)kinmem + 0x70) = 1;
    uVar16 = 0xfffffc1a;
    goto LAB_0010a9d5;
  }
  pKVar13 = (KINMem)kinmem;
  sVar19 = KINScFNorm((KINMem)kinmem,*(N_Vector *)((long)kinmem + 0x118),
                      *(N_Vector *)((long)kinmem + 0x130));
  KINPrintInfo(pKVar13,4,module_12,pcVar11,"scaled f norm (for stopping) = %12.3lg");
  uVar8 = 0;
  if (sVar19 <= *(double *)((long)kinmem + 0x20)) goto LAB_0010b8ba;
  p_Var2 = *(N_Vector *)((long)kinmem + 0x138);
  N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,*(undefined8 *)((long)kinmem + 0x110),
               *(undefined8 *)((long)kinmem + 0x108),p_Var2);
  sVar19 = KINScSNorm((KINMem)kinmem,p_Var2,*(N_Vector *)((long)kinmem + 0x110));
  if (sVar19 <= *(double *)((long)kinmem + 0x28)) {
    uVar8 = 2;
    if ((*(long *)((long)kinmem + 0x238) == 0) || (uVar8 = 2, *(int *)((long)kinmem + 100) != 0))
    goto LAB_0010b8ba;
    *(undefined8 *)((long)kinmem + 200) = 0x4000000000000000;
LAB_0010b8b4:
    uVar8 = 0xfffffc19;
    goto LAB_0010b8ba;
  }
  lVar15 = *(long *)((long)kinmem + 0xd0);
  uVar8 = 0xfffffffa;
  if (*(long *)((long)kinmem + 0x38) <= lVar15) goto LAB_0010b8ba;
  if (bVar17) {
    pcVar11 = (char *)(*(long *)((long)kinmem + 0x100) + 1);
    *(char **)((long)kinmem + 0x100) = pcVar11;
    uVar8 = 0xfffffff9;
    if (pcVar11 == (char *)0x5) goto LAB_0010b8ba;
  }
  else {
    *(undefined8 *)((long)kinmem + 0x100) = 0;
  }
  if (*(int *)((long)kinmem + 0x250) != 0) {
    *(sunrealtype *)((long)kinmem + 200) = sVar19;
    goto LAB_0010b8b4;
  }
  uVar8 = 0xfffffc19;
  if (*(int *)((long)kinmem + 0x6c) != 0) goto LAB_0010b8ba;
  pcVar11 = (char *)(lVar15 - *(long *)((long)kinmem + 0xe8));
  if ((long)pcVar11 < *(long *)((long)kinmem + 0x48)) {
    if (*(int *)((long)kinmem + 0x70) == 0) {
      if (*(int *)((long)kinmem + 0x74) != 0) {
        *(undefined8 *)((long)kinmem + 0x280) = *(undefined8 *)((long)kinmem + 0x260);
        goto LAB_0010b9c5;
      }
    }
    else {
      *(undefined8 *)((long)kinmem + 0x280) = *(undefined8 *)((long)kinmem + 0x260);
      if (*(int *)((long)kinmem + 0x74) != 0) {
LAB_0010b9c5:
        *(undefined4 *)((long)kinmem + 0x74) = 0;
      }
    }
  }
  else {
    *(long *)((long)kinmem + 0xe8) = lVar15;
    if (*(int *)((long)kinmem + 0x288) == 0) {
      dVar20 = *(double *)((long)kinmem + 0x290);
    }
    else {
      dVar20 = *(double *)((long)kinmem + 0x260) / *(double *)((long)kinmem + 0x20) + -1.0;
      dVar22 = 0.0;
      if (0.0 <= dVar20) {
        dVar22 = dVar20;
      }
      if (dVar22 <= 12.0) {
        dVar21 = *(double *)((long)kinmem + 0x298);
        dVar23 = exp(dVar22);
        dVar20 = *(double *)((long)kinmem + 0x2a0);
        if (dVar23 * dVar21 < dVar20) {
          dVar21 = *(double *)((long)kinmem + 0x298);
          dVar20 = exp(dVar22);
          dVar20 = dVar20 * dVar21;
        }
      }
      else {
        dVar20 = *(double *)((long)kinmem + 0x2a0);
      }
      *(double *)((long)kinmem + 0x290) = dVar20;
    }
    if (dVar20 * *(double *)((long)kinmem + 0x280) < *(double *)((long)kinmem + 0x260)) {
      if ((*(long *)((long)kinmem + 0x238) == 0) || (*(int *)((long)kinmem + 100) != 0))
      goto LAB_0010b8ba;
      uVar10 = 0x4000000000000000;
      goto LAB_0010ba7c;
    }
    *(double *)((long)kinmem + 0x280) = *(double *)((long)kinmem + 0x260);
  }
  uVar10 = 0x3ff0000000000000;
LAB_0010ba7c:
  *(undefined8 *)((long)kinmem + 200) = uVar10;
  goto LAB_0010b8ba;
LAB_0010b7a3:
  uVar8 = 0xfffffffb;
  if (*(int *)((long)kinmem + 0x30) == 0) {
    uVar8 = 2;
  }
LAB_0010b8ba:
  pKVar13 = *(KINMem *)((long)kinmem + 0x110);
  N_VScale(0x3ff0000000000000,pKVar13,*(undefined8 *)((long)kinmem + 0x108));
  *(double *)((long)kinmem + 0x268) = dVar24;
  uVar10 = *(undefined8 *)((long)kinmem + 0xd8);
  KINPrintInfo(pKVar13,2,module_13,pcVar11,"nni = %4ld, nfe = %6ld, fnorm = %26.16lg",
               *(undefined8 *)((long)kinmem + 0x260),*(undefined8 *)((long)kinmem + 0xd0),uVar10);
  uVar16 = 0xfffffc19;
  pcVar14 = extraout_RDX_41;
  if (uVar8 != 0xfffffc19) goto LAB_0010bb3d;
  goto LAB_0010a989;
LAB_0010bb3d:
  KINPrintInfo(pKVar13,1,pcVar14,pcVar11,"Return value: %d",(ulong)uVar8,uVar10);
  switch(uVar8) {
  case 0xfffffff1:
switchD_0010bb6b_caseD_fffffff1:
    pcVar11 = "KINSol";
    pcVar14 = "Unable to correct repeated recoverable system function errors.";
    uVar8 = 0xfffffff1;
    iVar7 = 0x2e6;
    break;
  default:
    goto switchD_0010bb6b_caseD_fffffff2;
  case 0xfffffff3:
switchD_0010bb6b_caseD_fffffff3:
    pcVar11 = "The system function failed in an unrecoverable manner.";
    uVar8 = 0xfffffff3;
    iVar7 = 0x2e2;
    goto LAB_0010a1e8;
  case 0xfffffff4:
    pcVar11 = "KINSol";
    pcVar14 = "The linear solver\'s solve function failed in an unrecoverable manner.";
    uVar8 = 0xfffffff4;
    iVar7 = 0x2ee;
    break;
  case 0xfffffff5:
    pcVar11 = "KINSol";
    pcVar14 = "The linear solver\'s setup function failed in an unrecoverable manner.";
    uVar8 = 0xfffffff5;
    iVar7 = 0x2ea;
    break;
  case 0xfffffff7:
    pcVar11 = "KINSol";
    pcVar14 = 
    "The linear solver\'s solve function failed recoverably, but the Jacobian data is already current."
    ;
    uVar8 = 0xfffffff7;
    iVar7 = 0x2f2;
    break;
  case 0xfffffff8:
switchD_0010bb6b_caseD_fffffff8:
    pcVar11 = "KINSol";
    pcVar14 = 
    "The line search algorithm was unable to satisfy the beta-condition for nbcfails iterations.";
    uVar8 = 0xfffffff8;
    iVar7 = 0x2fa;
    break;
  case 0xfffffff9:
    pcVar11 = "KINSol";
    pcVar14 = "Five consecutive steps have been taken that satisfy a scaled step length test.";
    uVar8 = 0xfffffff9;
    iVar7 = 0x302;
    break;
  case 0xfffffffa:
    pcVar11 = "KINSol";
    pcVar14 = "The maximum number of iterations was reached before convergence.";
    uVar8 = 0xfffffffa;
    iVar7 = 0x2fe;
    break;
  case 0xfffffffb:
    pcVar11 = 
    "The line search algorithm was unable to find an iterate sufficiently distinct from the current iterate."
    ;
    uVar8 = 0xfffffffb;
    iVar7 = 0x2f6;
LAB_0010a1e8:
    KINProcessError((KINMem)kinmem,uVar8,iVar7,"KINSol",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/kinsol/kinsol.c"
                    ,pcVar11);
    goto switchD_0010bb6b_caseD_fffffff2;
  }
LAB_0010a1ab:
  KINProcessError((KINMem)kinmem,uVar8,iVar7,pcVar11,
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/kinsol/kinsol.c"
                  ,pcVar14);
switchD_0010bb6b_caseD_fffffff2:
  return uVar8;
}

Assistant:

int KINSol(void* kinmem, N_Vector u, int strategy_in, N_Vector u_scale,
           N_Vector f_scale)
{
  sunrealtype fnormp, f1normp, epsmin;
  KINMem kin_mem;
  int ret, sflag;
  sunbooleantype maxStepTaken;

  /* initialize to avoid compiler warning messages */

  maxStepTaken = SUNFALSE;
  f1normp = fnormp = -ONE;

  /* initialize epsmin to avoid compiler warning message */

  epsmin = ZERO;

  /* check for kinmem non-NULL */

  if (kinmem == NULL)
  {
    KINProcessError(NULL, KIN_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (KIN_MEM_NULL);
  }
  kin_mem = (KINMem)kinmem;

  SUNDIALS_MARK_FUNCTION_BEGIN(KIN_PROFILER);

  if (kin_mem->kin_MallocDone == SUNFALSE)
  {
    KINProcessError(kin_mem, KIN_NO_MALLOC, __LINE__, __func__, __FILE__,
                    MSG_NO_MALLOC);
    SUNDIALS_MARK_FUNCTION_END(KIN_PROFILER);
    return (KIN_NO_MALLOC);
  }

  /* load input arguments */

  kin_mem->kin_uu             = u;
  kin_mem->kin_uscale         = u_scale;
  kin_mem->kin_fscale         = f_scale;
  kin_mem->kin_globalstrategy = strategy_in;

  /* CSW:
     Call fixed point solver if requested.  Note that this should probably
     be forked off to a FPSOL solver instead of kinsol in the future. */
  if (kin_mem->kin_globalstrategy == KIN_FP)
  {
    if (kin_mem->kin_uu == NULL)
    {
      KINProcessError(kin_mem, KIN_ILL_INPUT, __LINE__, __func__, __FILE__,
                      MSG_UU_NULL);
      SUNDIALS_MARK_FUNCTION_END(KIN_PROFILER);
      return (KIN_ILL_INPUT);
    }

    if (kin_mem->kin_constraintsSet != SUNFALSE)
    {
      KINProcessError(kin_mem, KIN_ILL_INPUT, __LINE__, __func__, __FILE__,
                      MSG_CONSTRAINTS_NOTOK);
      SUNDIALS_MARK_FUNCTION_END(KIN_PROFILER);
      return (KIN_ILL_INPUT);
    }

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGLEVEL_INFO
    KINPrintInfo(kin_mem, PRNT_TOL, "KINSOL", __func__, INFO_TOL,
                 kin_mem->kin_scsteptol, kin_mem->kin_fnormtol);
#endif

    kin_mem->kin_nfe = kin_mem->kin_nnilset = kin_mem->kin_nnilset_sub =
      kin_mem->kin_nni = kin_mem->kin_nbcf = kin_mem->kin_nbktrk = 0;
    ret = KINFP(kin_mem);

    switch (ret)
    {
    case KIN_SYSFUNC_FAIL:
      KINProcessError(kin_mem, KIN_SYSFUNC_FAIL, __LINE__, __func__, __FILE__,
                      MSG_SYSFUNC_FAILED);
      break;
    case KIN_MAXITER_REACHED:
      KINProcessError(kin_mem, KIN_MAXITER_REACHED, __LINE__, __func__,
                      __FILE__, MSG_MAXITER_REACHED);
      break;
    }

    SUNDIALS_MARK_FUNCTION_END(KIN_PROFILER);
    return (ret);
  }

  /* initialize solver */
  ret = KINSolInit(kin_mem);
  if (ret != KIN_SUCCESS)
  {
    SUNDIALS_MARK_FUNCTION_END(KIN_PROFILER);
    return (ret);
  }

  kin_mem->kin_ncscmx = 0;

  /* Note: The following logic allows the choice of whether or not
     to force a call to the linear solver setup upon a given call to
     KINSol */

  if (kin_mem->kin_noInitSetup) { kin_mem->kin_sthrsh = ONE; }
  else { kin_mem->kin_sthrsh = TWO; }

  /* if eps is to be bounded from below, set the bound */

  if (kin_mem->kin_inexact_ls && !(kin_mem->kin_noMinEps))
  {
    epsmin = POINT01 * kin_mem->kin_fnormtol;
  }

  /* if omega is zero at this point, make sure it will be evaluated
     at each iteration based on the provided min/max bounds and the
     current function norm. */
  if (kin_mem->kin_omega == ZERO) { kin_mem->kin_eval_omega = SUNTRUE; }
  else { kin_mem->kin_eval_omega = SUNFALSE; }

  /* CSW:
     Call fixed point solver for Picard method if requested.
     Note that this should probably be forked off to a part of an
     FPSOL solver instead of kinsol in the future. */
  if (kin_mem->kin_globalstrategy == KIN_PICARD)
  {
    if (kin_mem->kin_gval == NULL)
    {
      kin_mem->kin_gval = N_VClone(kin_mem->kin_unew);
      if (kin_mem->kin_gval == NULL)
      {
        KINProcessError(kin_mem, KIN_MEM_FAIL, __LINE__, __func__, __FILE__,
                        MSG_MEM_FAIL);
        SUNDIALS_MARK_FUNCTION_END(KIN_PROFILER);
        return (KIN_MEM_FAIL);
      }
      kin_mem->kin_liw += kin_mem->kin_liw1;
      kin_mem->kin_lrw += kin_mem->kin_lrw1;
    }
    ret = KINPicardAA(kin_mem);

    SUNDIALS_MARK_FUNCTION_END(KIN_PROFILER);
    return (ret);
  }

  for (;;)
  {
    kin_mem->kin_retry_nni = SUNFALSE;

    kin_mem->kin_nni++;

    /* calculate the epsilon (stopping criteria for iterative linear solver)
       for this iteration based on eta from the routine KINForcingTerm */

    if (kin_mem->kin_inexact_ls)
    {
      kin_mem->kin_eps = (kin_mem->kin_eta + kin_mem->kin_uround) *
                         kin_mem->kin_fnorm;
      if (!(kin_mem->kin_noMinEps))
      {
        kin_mem->kin_eps = SUNMAX(epsmin, kin_mem->kin_eps);
      }
    }

  repeat_nni:

    /* call the appropriate routine to calculate an acceptable step pp */

    sflag = 0;

    if (kin_mem->kin_globalstrategy == KIN_NONE)
    {
      /* Full Newton Step*/

      /* call KINLinSolDrv to calculate the (approximate) Newton step, pp */
      ret = KINLinSolDrv(kin_mem);
      if (ret != KIN_SUCCESS) { break; }

      sflag = KINFullNewton(kin_mem, &fnormp, &f1normp, &maxStepTaken);

      /* if sysfunc failed unrecoverably, stop */
      if ((sflag == KIN_SYSFUNC_FAIL) || (sflag == KIN_REPTD_SYSFUNC_ERR))
      {
        ret = sflag;
        break;
      }
    }
    else if (kin_mem->kin_globalstrategy == KIN_LINESEARCH)
    {
      /* Line Search */

      /* call KINLinSolDrv to calculate the (approximate) Newton step, pp */
      ret = KINLinSolDrv(kin_mem);
      if (ret != KIN_SUCCESS) { break; }

      sflag = KINLineSearch(kin_mem, &fnormp, &f1normp, &maxStepTaken);

      /* if sysfunc failed unrecoverably, stop */
      if ((sflag == KIN_SYSFUNC_FAIL) || (sflag == KIN_REPTD_SYSFUNC_ERR))
      {
        ret = sflag;
        break;
      }

      /* if too many beta condition failures, then stop iteration */
      if (kin_mem->kin_nbcf > kin_mem->kin_mxnbcf)
      {
        ret = KIN_LINESEARCH_BCFAIL;
        break;
      }
    }

    if ((kin_mem->kin_globalstrategy != KIN_PICARD) &&
        (kin_mem->kin_globalstrategy != KIN_FP))
    {
      /* evaluate eta by calling the forcing term routine */
      if (kin_mem->kin_callForcingTerm) { KINForcingTerm(kin_mem, fnormp); }

      kin_mem->kin_fnorm = fnormp;

      /* call KINStop to check if tolerances where met by this iteration */
      ret = KINStop(kin_mem, maxStepTaken, sflag);

      if (ret == RETRY_ITERATION)
      {
        kin_mem->kin_retry_nni = SUNTRUE;
        goto repeat_nni;
      }
    }

    /* update uu after the iteration */
    N_VScale(ONE, kin_mem->kin_unew, kin_mem->kin_uu);

    kin_mem->kin_f1norm = f1normp;

    /* print the current nni, fnorm, and nfe values */

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGLEVEL_INFO
    KINPrintInfo(kin_mem, PRNT_NNI, "KINSOL", __func__, INFO_NNI,
                 kin_mem->kin_nni, kin_mem->kin_nfe, kin_mem->kin_fnorm);
#endif

    if (ret != CONTINUE_ITERATIONS) { break; }

  } /* end of loop; return */

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGLEVEL_INFO
  KINPrintInfo(kin_mem, PRNT_RETVAL, "KINSOL", __func__, INFO_RETVAL, ret);
#endif

  switch (ret)
  {
  case KIN_SYSFUNC_FAIL:
    KINProcessError(kin_mem, KIN_SYSFUNC_FAIL, __LINE__, __func__, __FILE__,
                    MSG_SYSFUNC_FAILED);
    break;
  case KIN_REPTD_SYSFUNC_ERR:
    KINProcessError(kin_mem, KIN_REPTD_SYSFUNC_ERR, __LINE__, __func__,
                    __FILE__, MSG_SYSFUNC_REPTD);
    break;
  case KIN_LSETUP_FAIL:
    KINProcessError(kin_mem, KIN_LSETUP_FAIL, __LINE__, __func__, __FILE__,
                    MSG_LSETUP_FAILED);
    break;
  case KIN_LSOLVE_FAIL:
    KINProcessError(kin_mem, KIN_LSOLVE_FAIL, __LINE__, __func__, __FILE__,
                    MSG_LSOLVE_FAILED);
    break;
  case KIN_LINSOLV_NO_RECOVERY:
    KINProcessError(kin_mem, KIN_LINSOLV_NO_RECOVERY, __LINE__, __func__,
                    __FILE__, MSG_LINSOLV_NO_RECOVERY);
    break;
  case KIN_LINESEARCH_NONCONV:
    KINProcessError(kin_mem, KIN_LINESEARCH_NONCONV, __LINE__, __func__,
                    __FILE__, MSG_LINESEARCH_NONCONV);
    break;
  case KIN_LINESEARCH_BCFAIL:
    KINProcessError(kin_mem, KIN_LINESEARCH_BCFAIL, __LINE__, __func__,
                    __FILE__, MSG_LINESEARCH_BCFAIL);
    break;
  case KIN_MAXITER_REACHED:
    KINProcessError(kin_mem, KIN_MAXITER_REACHED, __LINE__, __func__, __FILE__,
                    MSG_MAXITER_REACHED);
    break;
  case KIN_MXNEWT_5X_EXCEEDED:
    KINProcessError(kin_mem, KIN_MXNEWT_5X_EXCEEDED, __LINE__, __func__,
                    __FILE__, MSG_MXNEWT_5X_EXCEEDED);
    break;
  }

  SUNDIALS_MARK_FUNCTION_END(KIN_PROFILER);
  return (ret);
}